

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImageConvolution(gdImagePtr src,float (*filter) [3],float filter_div,float offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int color;
  gdImagePtr im;
  code *pcVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float (*pafVar13) [3];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint local_84;
  long local_78;
  
  iVar1 = 0;
  if ((src != (gdImagePtr)0x0) &&
     (im = gdImageCreateTrueColor(src->sx,src->sy), iVar1 = 0, im != (gdImagePtr)0x0)) {
    gdImageSaveAlpha(im,1);
    iVar1 = gdImageColorAllocateAlpha(im,0,0,0,0x7f);
    gdImageFill(im,0,0,iVar1);
    gdImageCopy(im,src,0,0,0,0,src->sx,src->sy);
    if (src->trueColor == 0) {
      pcVar5 = gdImageGetPixel;
    }
    else {
      pcVar5 = gdImageGetTrueColorPixel;
    }
    if (0 < src->sy) {
      local_78 = 0;
      uVar3 = 0;
      do {
        if (0 < src->sx) {
          iVar1 = -1;
          lVar12 = 0;
          do {
            if (im->trueColor == 0) {
              local_84 = im->alpha[(int)uVar3];
            }
            else {
              local_84 = uVar3 >> 0x18 & 0x7f;
            }
            fVar15 = 0.0;
            lVar7 = 0;
            fVar16 = 0.0;
            fVar17 = 0.0;
            pafVar13 = filter;
            do {
              iVar2 = (int)local_78 + -1 + (int)lVar7;
              if (iVar2 < 1) {
                iVar2 = 0;
              }
              iVar11 = src->sy + -1;
              if (iVar2 < iVar11) {
                iVar11 = iVar2;
              }
              lVar9 = 0;
              do {
                iVar2 = iVar1 + (int)lVar9;
                if (iVar2 < 1) {
                  iVar2 = 0;
                }
                iVar10 = src->sx + -1;
                if (iVar2 < iVar10) {
                  iVar10 = iVar2;
                }
                uVar3 = (*pcVar5)(im,iVar10,iVar11);
                if (im->trueColor == 0) {
                  uVar4 = im->red[(int)uVar3];
                }
                else {
                  uVar4 = uVar3 >> 0x10 & 0xff;
                }
                fVar14 = (*pafVar13)[lVar9];
                if (im->trueColor == 0) {
                  uVar8 = im->green[(int)uVar3];
                  uVar6 = im->blue[(int)uVar3];
                }
                else {
                  uVar8 = uVar3 >> 8 & 0xff;
                  uVar6 = uVar3 & 0xff;
                }
                fVar17 = fVar17 + (float)(int)uVar4 * fVar14;
                fVar16 = fVar16 + (float)(int)uVar8 * fVar14;
                fVar15 = fVar15 + (float)(int)uVar6 * fVar14;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              lVar7 = lVar7 + 1;
              pafVar13 = pafVar13 + 1;
            } while (lVar7 != 3);
            fVar17 = fVar17 / filter_div + offset;
            iVar2 = 0xff;
            iVar11 = 0xff;
            if (fVar17 <= 255.0) {
              fVar14 = 0.0;
              if (0.0 <= fVar17) {
                fVar14 = fVar17;
              }
              iVar11 = (int)fVar14;
            }
            fVar16 = fVar16 / filter_div + offset;
            if (fVar16 <= 255.0) {
              fVar17 = 0.0;
              if (0.0 <= fVar16) {
                fVar17 = fVar16;
              }
              iVar2 = (int)fVar17;
            }
            fVar15 = fVar15 / filter_div + offset;
            iVar10 = 0xff;
            if (fVar15 <= 255.0) {
              fVar16 = 0.0;
              if (0.0 <= fVar15) {
                fVar16 = fVar15;
              }
              iVar10 = (int)fVar16;
            }
            color = gdImageColorAllocateAlpha(src,iVar11,iVar2,iVar10,local_84);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,iVar11,iVar2,iVar10,local_84);
            }
            gdImageSetPixel(src,(int)lVar12,(int)local_78,color);
            lVar12 = lVar12 + 1;
            iVar1 = iVar1 + 1;
          } while (lVar12 < src->sx);
        }
        local_78 = local_78 + 1;
      } while (local_78 < src->sy);
    }
    gdImageDestroy(im);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageConvolution(gdImagePtr src, float filter[3][3], float filter_div, float offset)
{
	int         x, y, i, j, new_a;
	float       new_r, new_g, new_b;
	int         new_pxl, pxl=0;
	gdImagePtr  srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}

	gdImageSaveAlpha(srcback, 1);
	new_pxl = gdImageColorAllocateAlpha(srcback, 0, 0, 0, 127);
	gdImageFill(srcback, 0, 0, new_pxl);

	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for ( y=0; y<src->sy; y++) {
		for(x=0; x<src->sx; x++) {
			new_r = new_g = new_b = 0;
			new_a = gdImageAlpha(srcback, pxl);

			for (j=0; j<3; j++) {
				int yv = MIN(MAX(y - 1 + j, 0), src->sy - 1);
				for (i=0; i<3; i++) {
				        pxl = f(srcback, MIN(MAX(x - 1 + i, 0), src->sx - 1), yv);
					new_r += (float)gdImageRed(srcback, pxl) * filter[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * filter[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * filter[j][i];
				}
			}

			new_r = (new_r/filter_div)+offset;
			new_g = (new_g/filter_div)+offset;
			new_b = (new_b/filter_div)+offset;

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}